

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::reset_buf(Snes_Spc *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  for (uVar2 = 0x8c0; uVar2 < 0x8d0; uVar2 = uVar2 + 2) {
    puVar1 = (this->dsp).m.regs + uVar2;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
  }
  (this->m).extra_pos = (sample_t_conflict1 *)((this->dsp).m.regs + uVar2);
  (this->m).buf_begin = (sample_t_conflict1 *)0x0;
  Spc_Dsp::set_output(&this->dsp,(sample_t_conflict1 *)0x0,0);
  return;
}

Assistant:

void Snes_Spc::reset_buf()
{
	// Start with half extra buffer of silence
	sample_t* out = m.extra_buf;
	while ( out < &m.extra_buf [extra_size / 2] )
		*out++ = 0;
	
	m.extra_pos = out;
	m.buf_begin = 0;
	
	dsp.set_output( 0, 0 );
}